

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

void fasttext::averageRowsFast<32u>
               (Vector *x,vector<int,_std::allocator<int>_> *rows,DenseMatrix *matrix)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_XMM2 [16];
  Register accum [2];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  auVar12 = in_ZMM0._0_16_;
  if (((ulong)(x->data_).mem_ & 0x3f) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(x.data()) % sizeof(Register) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0xb3,
                  "void fasttext::averageRowsFast(Vector &, const std::vector<int32_t> &, const DenseMatrix &) [Cols = 32U]"
                 );
  }
  pfVar3 = (matrix->data_).mem_;
  if (((ulong)pfVar3 & 0x3f) == 0) {
    piVar4 = (rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar5 = (rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    if (piVar4 == piVar5) {
      Vector::zero(x);
      auVar12 = vcvtusi2sd_avx512f(auVar12,(long)(rows->
                                                 super__Vector_base<int,_std::allocator<int>_>).
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(rows->
                                                 super__Vector_base<int,_std::allocator<int>_>).
                                                 _M_impl.super__Vector_impl_data._M_start >> 2);
      Vector::mul(x,(float)(1.0 / auVar12._0_8_));
    }
    else {
      lVar6 = (matrix->super_Matrix).n_;
      lVar7 = *piVar4 * lVar6;
      pfVar1 = pfVar3 + lVar7;
      local_100 = *(undefined8 *)pfVar1;
      uStack_f8 = *(undefined8 *)(pfVar1 + 2);
      uStack_f0 = *(undefined8 *)(pfVar1 + 4);
      uStack_e8 = *(undefined8 *)(pfVar1 + 6);
      uStack_e0 = *(undefined8 *)(pfVar1 + 8);
      uStack_d8 = *(undefined8 *)(pfVar1 + 10);
      uStack_d0 = *(undefined8 *)(pfVar1 + 0xc);
      uStack_c8 = *(undefined8 *)(pfVar1 + 0xe);
      pfVar1 = pfVar3 + lVar7 + 0x10;
      local_c0 = *(undefined8 *)pfVar1;
      uStack_b8 = *(undefined8 *)(pfVar1 + 2);
      uStack_b0 = *(undefined8 *)(pfVar1 + 4);
      uStack_a8 = *(undefined8 *)(pfVar1 + 6);
      uStack_a0 = *(undefined8 *)(pfVar1 + 8);
      uStack_98 = *(undefined8 *)(pfVar1 + 10);
      uStack_90 = *(undefined8 *)(pfVar1 + 0xc);
      uStack_88 = *(undefined8 *)(pfVar1 + 0xe);
      piVar8 = piVar4;
      while (piVar8 = piVar8 + 1, piVar8 != piVar5) {
        iVar2 = *piVar8;
        for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 0x40) {
          auVar9 = vaddps_avx512f(*(undefined1 (*) [64])((long)&local_100 + lVar7),
                                  *(undefined1 (*) [64])((long)pfVar3 + lVar7 + iVar2 * lVar6 * 4));
          *(undefined1 (*) [64])((long)&local_100 + lVar7) = auVar9;
        }
      }
      lVar6 = 0;
      auVar12 = vcvtusi2sd_avx512f(in_XMM2,(long)piVar5 - (long)piVar4 >> 2);
      dVar11 = 1.0 / auVar12._0_8_;
      auVar12._0_4_ = (float)dVar11;
      auVar12._4_4_ = (int)((ulong)dVar11 >> 0x20);
      auVar12._8_8_ = 0;
      auVar9 = vbroadcastss_avx512f(auVar12);
      for (; lVar6 != 0x80; lVar6 = lVar6 + 0x40) {
        auVar10 = vmulps_avx512f(auVar9,*(undefined1 (*) [64])((long)&local_100 + lVar6));
        *(undefined1 (*) [64])((long)(x->data_).mem_ + lVar6) = auVar10;
      }
    }
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(matrix.data()) % sizeof(Register) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                ,0xb4,
                "void fasttext::averageRowsFast(Vector &, const std::vector<int32_t> &, const DenseMatrix &) [Cols = 32U]"
               );
}

Assistant:

void averageRowsFast(Vector& x, const std::vector<int32_t>& rows, const DenseMatrix &matrix) {
  // Columns must be a multiple of how many floats fit in a register.
  static_assert(Cols % (sizeof(Register) / 4) == 0);
  constexpr unsigned RegisterCount = Cols / (sizeof(Register) / 4);
  // These should be aligned by aligned.h
  assert(reinterpret_cast<uintptr_t>(x.data()) % sizeof(Register) == 0);
  assert(reinterpret_cast<uintptr_t>(matrix.data()) % sizeof(Register) == 0);

  // Guard against empty list of rows with default NaN behavior.
  if (rows.empty()) {
    x.zero();
    x.mul(1.0 / rows.size());
    return;
  }

  // Copy the first row to accumulation registers.
  Register accum[RegisterCount];
  auto row = rows.cbegin();
  const Register *base = reinterpret_cast<const Register*>(matrix.data() + matrix.cols() * *row);
  for (unsigned i = 0; i < RegisterCount; ++i) {
    accum[i] = base[i];
  }
  // Add the rows after the first.
  for (++row; row != rows.cend(); ++row) {
    base = reinterpret_cast<const Register*>(matrix.data() + matrix.cols() * *row);
    for (unsigned i = 0; i < RegisterCount; ++i) {
      accum[i] = Add(accum[i], base[i]);
    }
  }
  // Multiply by (1.0 / rows.size()) and write to x.
  Register mul = Set1(1.0 / rows.size());
  for (unsigned i = 0; i < RegisterCount; ++i) {
    reinterpret_cast<Register*>(x.data())[i] = Multiply(accum[i], mul);
  }
}